

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_trap(DisasContext_conflict6 *ctx,uint32_t opc,int rs,int rt,int16_t imm)

{
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o_3;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGLabel *l;
  TCGv_i32 pTVar1;
  TCGv_i64 pTVar2;
  TCGOpcode TVar3;
  TCGCond cond;
  uintptr_t o_4;
  TCGv_i64 arg1;
  uintptr_t o_5;
  TCGv_i64 arg2;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg2 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((int)opc < 0x4080000) {
    if ((0x36 < opc) || ((0x5f000000000000U >> ((ulong)opc & 0x3f) & 1) == 0)) goto LAB_0099f592;
    if (rs == rt) goto LAB_0099f391;
    if (rs == 0) {
      TVar3 = INDEX_op_movi_i64;
      pTVar2 = (TCGv_i64)0x0;
LAB_0099f42f:
      tcg_gen_op2_mips64el(s,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
    }
    else if (s->cpu_gpr[rs] != arg1) {
      pTVar2 = s->cpu_gpr[rs] + (long)s;
      TVar3 = INDEX_op_mov_i64;
      goto LAB_0099f42f;
    }
    if (rt == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_00,0);
    }
    else if (s->cpu_gpr[rt] != arg2) {
      pTVar2 = s->cpu_gpr[rt] + (long)s;
      TVar3 = INDEX_op_mov_i64;
      goto LAB_0099f45e;
    }
  }
  else {
    if ((int)opc < 0x40b0000) {
      if (((opc != 0x4080000) && (opc != 0x4090000)) && (opc != 0x40a0000)) goto LAB_0099f592;
    }
    else if (((opc != 0x40b0000) && (opc != 0x40c0000)) && (opc != 0x40e0000)) goto LAB_0099f592;
    if (rs == 0 && imm == 0) {
LAB_0099f391:
      if ((int)opc < 0x4080000) {
        if ((0x34 < opc) || ((0x13000000000000U >> ((ulong)opc & 0x3f) & 1) == 0))
        goto LAB_0099f592;
      }
      else if (((opc != 0x4080000) && (opc != 0x40c0000)) && (opc != 0x4090000)) goto LAB_0099f592;
      generate_exception_err(ctx,0x16,0);
      goto LAB_0099f592;
    }
    if (rs == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1,0);
    }
    else if (s->cpu_gpr[rs] != arg1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(s->cpu_gpr[rs] + (long)s));
    }
    pTVar2 = (TCGv_i64)(long)imm;
    TVar3 = INDEX_op_movi_i64;
LAB_0099f45e:
    tcg_gen_op2_mips64el(s,TVar3,(TCGArg)a1_00,(TCGArg)pTVar2);
  }
  l = gen_new_label_mips64el(s);
  cond = TCG_COND_NE;
  if ((int)opc < 0x4080000) {
    switch(opc) {
    case 0x30:
switchD_0099f4b3_caseD_30:
      cond = TCG_COND_LT;
      break;
    case 0x31:
switchD_0099f4b3_caseD_31:
      cond = TCG_COND_LTU;
      break;
    case 0x32:
switchD_0099f4b3_caseD_32:
      cond = TCG_COND_GE;
      break;
    case 0x33:
switchD_0099f4b3_caseD_33:
      cond = TCG_COND_GEU;
      break;
    case 0x34:
      break;
    default:
      goto switchD_0099f4b3_caseD_35;
    case 0x36:
switchD_0099f4b3_caseD_36:
      cond = TCG_COND_EQ;
    }
switchD_0099f4b3_caseD_34:
    tcg_gen_brcond_i64_mips64el(s,cond,arg1,arg2,l);
  }
  else if ((int)opc < 0x40b0000) {
    if (opc == 0x4080000) goto switchD_0099f4b3_caseD_30;
    if (opc == 0x4090000) goto switchD_0099f4b3_caseD_31;
    if (opc == 0x40a0000) goto switchD_0099f4b3_caseD_32;
  }
  else {
    if (opc == 0x40b0000) goto switchD_0099f4b3_caseD_33;
    if (opc == 0x40c0000) goto switchD_0099f4b3_caseD_34;
    if (opc == 0x40e0000) goto switchD_0099f4b3_caseD_36;
  }
switchD_0099f4b3_caseD_35:
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar1 = tcg_const_i32_mips64el(tcg_ctx,0x16);
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_mips64el(tcg_ctx,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_48);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
LAB_0099f592:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg1 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg2 + (long)s));
  return;
}

Assistant:

static void gen_trap(DisasContext *ctx, uint32_t opc,
                     int rs, int rt, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int cond;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    cond = 0;
    /* Load needed operands */
    switch (opc) {
    case OPC_TEQ:
    case OPC_TGE:
    case OPC_TGEU:
    case OPC_TLT:
    case OPC_TLTU:
    case OPC_TNE:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            cond = 1;
        }
        break;
    case OPC_TEQI:
    case OPC_TGEI:
    case OPC_TGEIU:
    case OPC_TLTI:
    case OPC_TLTIU:
    case OPC_TNEI:
        /* Compare register to immediate */
        if (rs != 0 || imm != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            tcg_gen_movi_tl(tcg_ctx, t1, (int32_t)imm);
            cond = 1;
        }
        break;
    }
    if (cond == 0) {
        switch (opc) {
        case OPC_TEQ:   /* rs == rs */
        case OPC_TEQI:  /* r0 == 0  */
        case OPC_TGE:   /* rs >= rs */
        case OPC_TGEI:  /* r0 >= 0  */
        case OPC_TGEU:  /* rs >= rs unsigned */
        case OPC_TGEIU: /* r0 >= 0  unsigned */
            /* Always trap */
            generate_exception_end(ctx, EXCP_TRAP);
            break;
        case OPC_TLT:   /* rs < rs           */
        case OPC_TLTI:  /* r0 < 0            */
        case OPC_TLTU:  /* rs < rs unsigned  */
        case OPC_TLTIU: /* r0 < 0  unsigned  */
        case OPC_TNE:   /* rs != rs          */
        case OPC_TNEI:  /* r0 != 0           */
            /* Never trap: treat as NOP. */
            break;
        }
    } else {
        TCGLabel *l1 = gen_new_label(tcg_ctx);

        switch (opc) {
        case OPC_TEQ:
        case OPC_TEQI:
            tcg_gen_brcond_tl(tcg_ctx, TCG_COND_NE, t0, t1, l1);
            break;
        case OPC_TGE:
        case OPC_TGEI:
            tcg_gen_brcond_tl(tcg_ctx, TCG_COND_LT, t0, t1, l1);
            break;
        case OPC_TGEU:
        case OPC_TGEIU:
            tcg_gen_brcond_tl(tcg_ctx, TCG_COND_LTU, t0, t1, l1);
            break;
        case OPC_TLT:
        case OPC_TLTI:
            tcg_gen_brcond_tl(tcg_ctx, TCG_COND_GE, t0, t1, l1);
            break;
        case OPC_TLTU:
        case OPC_TLTIU:
            tcg_gen_brcond_tl(tcg_ctx, TCG_COND_GEU, t0, t1, l1);
            break;
        case OPC_TNE:
        case OPC_TNEI:
            tcg_gen_brcond_tl(tcg_ctx, TCG_COND_EQ, t0, t1, l1);
            break;
        }
        generate_exception(ctx, EXCP_TRAP);
        gen_set_label(tcg_ctx, l1);
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}